

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

void av1_make_default_fullpel_ms_params
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize
               ,MV *ref_mv,FULLPEL_MV start_mv,search_site_config *search_sites,
               SEARCH_METHODS search_method,int fine_search_interval)

{
  FRAME_UPDATE_TYPE FVar1;
  AV1_PRIMARY *pAVar2;
  MvCosts *pMVar3;
  buf_2d *pbVar4;
  buf_2d *pbVar5;
  uint8_t *puVar6;
  aom_sad_multi_d_fn_t p_Var7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int32_t *piVar11;
  uint uVar12;
  uint uVar13;
  aom_variance_fn_ptr_t *paVar14;
  int iVar15;
  int iVar16;
  undefined7 in_register_00000009;
  short sVar17;
  int iVar18;
  ulong uVar19;
  short sVar20;
  int iVar21;
  int iVar22;
  uint8_t *puVar23;
  
  pAVar2 = cpi->ppi;
  FVar1 = (pAVar2->gf_group).update_type[cpi->gf_frame_index];
  ms_params->bsize = bsize;
  uVar19 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  ms_params->vfp = pAVar2->fn_ptr + uVar19;
  (ms_params->ms_buffers).ref = (x->e_mbd).plane[0].pre;
  (ms_params->ms_buffers).src = &x->plane[0].src;
  (ms_params->ms_buffers).second_pred = (uint8_t *)0x0;
  (ms_params->ms_buffers).mask = (uint8_t *)0x0;
  (ms_params->ms_buffers).mask_stride = 0;
  (ms_params->ms_buffers).inv_mask = 0;
  piVar11 = (x->obmc_buffer).mask;
  (ms_params->ms_buffers).wsrc = (x->obmc_buffer).wsrc;
  (ms_params->ms_buffers).obmc_mask = piVar11;
  ms_params->search_method = search_method;
  ms_params->search_sites = search_sites + ""[search_method];
  ms_params->mesh_patterns[0] = (cpi->sf).mv_sf.mesh_patterns;
  ms_params->mesh_patterns[1] = (cpi->sf).mv_sf.intrabc_mesh_patterns;
  ms_params->force_mesh_thresh = (cpi->sf).mv_sf.exhaustive_searches_thresh;
  ms_params->prune_mesh_search =
       (uint)((cpi->sf).mv_sf.prune_mesh_search == PRUNE_MESH_SEARCH_LVL_2);
  ms_params->mesh_search_mv_diff_threshold = 4;
  ms_params->run_mesh_search = 0;
  ms_params->fine_search_interval = fine_search_interval;
  ms_params->is_intra_mode = 0;
  ms_params->fast_obmc_search = (cpi->sf).mv_sf.obmc_full_pixel_search_level;
  iVar22 = (x->mv_limits).col_max;
  iVar16 = (x->mv_limits).row_min;
  iVar21 = (x->mv_limits).row_max;
  (ms_params->mv_limits).col_min = (x->mv_limits).col_min;
  (ms_params->mv_limits).col_max = iVar22;
  (ms_params->mv_limits).row_min = iVar16;
  (ms_params->mv_limits).row_max = iVar21;
  av1_set_mv_search_range(&ms_params->mv_limits,ref_mv);
  if ((cpi->oxcf).algo_cfg.sharpness == 3) {
    iVar22 = (x->e_mbd).mi_row;
    iVar16 = (x->e_mbd).mi_col;
    iVar15 = (cpi->common).height +
             ((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [uVar19] + iVar22) * -4 + 8;
    iVar18 = (cpi->common).width +
             ((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [uVar19] + iVar16) * -4 + 8;
    iVar21 = (ms_params->mv_limits).row_min;
    iVar22 = iVar22 * -4 + -8;
    if (iVar22 < iVar21) {
      iVar22 = iVar21;
    }
    (ms_params->mv_limits).row_min = iVar22;
    iVar22 = (ms_params->mv_limits).row_max;
    if (iVar22 < iVar15) {
      iVar15 = iVar22;
    }
    (ms_params->mv_limits).row_max = iVar15;
    iVar21 = iVar16 * -4 + -8;
    iVar22 = (ms_params->mv_limits).col_min;
    iVar16 = (ms_params->mv_limits).col_max;
    if (iVar21 < iVar22) {
      iVar21 = iVar22;
    }
    (ms_params->mv_limits).col_min = iVar21;
    if (iVar16 < iVar18) {
      iVar18 = iVar16;
    }
    (ms_params->mv_limits).col_max = iVar18;
  }
  pMVar3 = x->mv_costs;
  (ms_params->mv_cost_params).ref_mv = ref_mv;
  sVar20 = ref_mv->row;
  sVar17 = ref_mv->col;
  (ms_params->mv_cost_params).mv_cost_type = '\0';
  iVar22 = x->errorperbit;
  iVar16 = x->sadperbit;
  (ms_params->mv_cost_params).full_ref_mv =
       (FULLPEL_MV)
       (((int)sVar20 - (~(int)sVar20 >> 0x1f)) + 3U >> 3 & 0xffff |
       ((int)sVar17 - (~(int)sVar17 >> 0x1f)) * 0x2000 + 0x6000U & 0xffff0000);
  (ms_params->mv_cost_params).error_per_bit = iVar22;
  (ms_params->mv_cost_params).sad_per_bit = iVar16;
  if (pMVar3 != (MvCosts *)0x0) {
    (ms_params->mv_cost_params).mvjcost = pMVar3->nmv_joint_cost;
    (ms_params->mv_cost_params).mvcost[0] = *pMVar3->mv_cost_stack;
    (ms_params->mv_cost_params).mvcost[1] = pMVar3->mv_cost_stack[1];
  }
  paVar14 = ms_params->vfp;
  ms_params->sdf = paVar14->sdf;
  uVar8 = *(undefined4 *)((long)&paVar14->sdx4df + 4);
  uVar9 = *(undefined4 *)&paVar14->sdx3df;
  uVar10 = *(undefined4 *)((long)&paVar14->sdx3df + 4);
  *(undefined4 *)&ms_params->sdx4df = *(undefined4 *)&paVar14->sdx4df;
  *(undefined4 *)((long)&ms_params->sdx4df + 4) = uVar8;
  *(undefined4 *)&ms_params->sdx3df = uVar9;
  *(undefined4 *)((long)&ms_params->sdx3df + 4) = uVar10;
  iVar22 = (cpi->sf).mv_sf.use_downsampled_sad;
  if (iVar22 == 1) {
    if ((0xa002fUL >> ((ulong)bsize & 0x3f) & 1) != 0) {
      return;
    }
    if (FVar1 == '\0') {
      return;
    }
    iVar21 = (int)start_mv >> 0x10;
    iVar22 = (ms_params->mv_limits).col_min;
    iVar16 = (ms_params->mv_limits).col_max;
    if (iVar21 < iVar16) {
      iVar16 = iVar21;
    }
    sVar20 = (short)iVar16;
    if (iVar21 < iVar22) {
      sVar20 = (short)iVar22;
    }
    iVar16 = (int)start_mv.row;
    iVar22 = (ms_params->mv_limits).row_max;
    if (iVar16 < iVar22) {
      iVar22 = iVar16;
    }
    sVar17 = (short)iVar22;
    iVar22 = (ms_params->mv_limits).row_min;
    if (iVar16 < iVar22) {
      sVar17 = (short)iVar22;
    }
    pbVar4 = (ms_params->ms_buffers).ref;
    pbVar5 = (ms_params->ms_buffers).src;
    iVar22 = pbVar4->stride;
    puVar23 = pbVar4->buf + ((int)sVar20 + sVar17 * iVar22);
    puVar6 = pbVar5->buf;
    iVar16 = pbVar5->stride;
    uVar12 = (*paVar14->sdsf)(puVar6,iVar16,puVar23,iVar22);
    uVar13 = (*ms_params->vfp->sdsf)(puVar6 + iVar16,iVar16,puVar23 + iVar22,iVar22);
    iVar16 = uVar12 - uVar13;
    iVar22 = -iVar16;
    if (0 < iVar16) {
      iVar22 = iVar16;
    }
    if ((int)uVar12 <= iVar22 * 4) {
      return;
    }
    paVar14 = ms_params->vfp;
  }
  else {
    if (iVar22 != 2) {
      return;
    }
    if ((0x35ffd0UL >> ((ulong)bsize & 0x3f) & 1) == 0) {
      return;
    }
  }
  ms_params->sdf = paVar14->sdsf;
  p_Var7 = paVar14->sdsx4df;
  ms_params->sdx4df = p_Var7;
  ms_params->sdx3df = p_Var7;
  return;
}

Assistant:

void av1_make_default_fullpel_ms_params(
    FULLPEL_MOTION_SEARCH_PARAMS *ms_params, const struct AV1_COMP *cpi,
    MACROBLOCK *x, BLOCK_SIZE bsize, const MV *ref_mv, FULLPEL_MV start_mv,
    const search_site_config search_sites[NUM_DISTINCT_SEARCH_METHODS],
    SEARCH_METHODS search_method, int fine_search_interval) {
  const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
  const int is_key_frame =
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index] == KF_UPDATE;

  // High level params
  ms_params->bsize = bsize;
  ms_params->vfp = &cpi->ppi->fn_ptr[bsize];

  init_ms_buffers(&ms_params->ms_buffers, x);

  av1_set_mv_search_method(ms_params, search_sites, search_method);

  ms_params->mesh_patterns[0] = mv_sf->mesh_patterns;
  ms_params->mesh_patterns[1] = mv_sf->intrabc_mesh_patterns;
  ms_params->force_mesh_thresh = mv_sf->exhaustive_searches_thresh;
  ms_params->prune_mesh_search =
      (cpi->sf.mv_sf.prune_mesh_search == PRUNE_MESH_SEARCH_LVL_2) ? 1 : 0;
  ms_params->mesh_search_mv_diff_threshold = 4;
  ms_params->run_mesh_search = 0;
  ms_params->fine_search_interval = fine_search_interval;

  ms_params->is_intra_mode = 0;

  ms_params->fast_obmc_search = mv_sf->obmc_full_pixel_search_level;

  ms_params->mv_limits = x->mv_limits;
  av1_set_mv_search_range(&ms_params->mv_limits, ref_mv);

  if (cpi->oxcf.algo_cfg.sharpness == 3) {
    int top_margin = x->e_mbd.mi_row * MI_SIZE + 8;
    int left_margin = x->e_mbd.mi_col * MI_SIZE + 8;
    int bottom_margin =
        cpi->common.height - mi_size_high[bsize] * MI_SIZE - top_margin + 16;
    int right_margin =
        cpi->common.width - mi_size_wide[bsize] * MI_SIZE - left_margin + 16;
    FullMvLimits *mv_limits = &ms_params->mv_limits;
    mv_limits->row_min = AOMMAX(mv_limits->row_min, -top_margin);
    mv_limits->row_max = AOMMIN(mv_limits->row_max, bottom_margin);
    mv_limits->col_min = AOMMAX(mv_limits->col_min, -left_margin);
    mv_limits->col_max = AOMMIN(mv_limits->col_max, right_margin);
  }

  // Mvcost params
  init_mv_cost_params(&ms_params->mv_cost_params, x->mv_costs, ref_mv,
                      x->errorperbit, x->sadperbit);

  ms_params->sdf = ms_params->vfp->sdf;
  ms_params->sdx4df = ms_params->vfp->sdx4df;
  ms_params->sdx3df = ms_params->vfp->sdx3df;

  if (mv_sf->use_downsampled_sad == 2 && block_size_high[bsize] >= 16) {
    assert(ms_params->vfp->sdsf != NULL);
    ms_params->sdf = ms_params->vfp->sdsf;
    assert(ms_params->vfp->sdsx4df != NULL);
    ms_params->sdx4df = ms_params->vfp->sdsx4df;
    // Skip version of sadx3 is not available yet
    ms_params->sdx3df = ms_params->vfp->sdsx4df;
  } else if (mv_sf->use_downsampled_sad == 1 && block_size_high[bsize] >= 16 &&
             !is_key_frame) {
    FULLPEL_MV start_mv_clamped = start_mv;
    // adjust start_mv to make sure it is within MV range
    clamp_fullmv(&start_mv_clamped, &ms_params->mv_limits);

    const struct buf_2d *const ref = ms_params->ms_buffers.ref;
    const int ref_stride = ref->stride;
    const uint8_t *best_address = get_buf_from_fullmv(ref, &start_mv_clamped);
    const struct buf_2d *const src = ms_params->ms_buffers.src;
    const uint8_t *src_buf = src->buf;
    const int src_stride = src->stride;

    unsigned int start_mv_sad_even_rows, start_mv_sad_odd_rows;
    assert(ms_params->vfp->sdsf != NULL);
    start_mv_sad_even_rows =
        ms_params->vfp->sdsf(src_buf, src_stride, best_address, ref_stride);
    start_mv_sad_odd_rows =
        ms_params->vfp->sdsf(src_buf + src_stride, src_stride,
                             best_address + ref_stride, ref_stride);

    // If the absolute SAD difference computed between the pred-to-src of even
    // and odd rows is small, skip every other row in sad computation.
    const int odd_to_even_diff_sad =
        abs((int)start_mv_sad_even_rows - (int)start_mv_sad_odd_rows);
    const int mult_thresh = 4;
    if (odd_to_even_diff_sad * mult_thresh < (int)start_mv_sad_even_rows) {
      ms_params->sdf = ms_params->vfp->sdsf;
      assert(ms_params->vfp->sdsx4df != NULL);
      ms_params->sdx4df = ms_params->vfp->sdsx4df;
      ms_params->sdx3df = ms_params->vfp->sdsx4df;
    }
  }
}